

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O3

size_t ggml_backend_sched_get_buffer_size(ggml_backend_sched_t sched,ggml_backend_t backend)

{
  int iVar1;
  ggml_backend_t in_RAX;
  size_t sVar2;
  long lVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  
  iVar1 = sched->n_backends;
  if (0 < (long)iVar1) {
    lVar3 = 0;
    do {
      in_RAX = backend;
      if (sched->backends[lVar3] == backend) {
        if ((int)lVar3 < iVar1) {
          sVar2 = ggml_gallocr_get_buffer_size(sched->galloc,(int)lVar3);
          return sVar2;
        }
        break;
      }
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
             ,0x657,"GGML_ASSERT(%s) failed",
             "backend_index >= 0 && backend_index < sched->n_backends",in_R8,in_R9,in_RAX);
}

Assistant:

size_t ggml_backend_sched_get_buffer_size(ggml_backend_sched_t sched, ggml_backend_t backend) {
    int backend_index = ggml_backend_sched_backend_id(sched, backend);
    GGML_ASSERT(backend_index >= 0 && backend_index < sched->n_backends);

    return ggml_gallocr_get_buffer_size(sched->galloc, backend_index);
}